

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

_Bool Curl_cpool_find(Curl_easy *data,char *destination,size_t dest_len,
                     Curl_cpool_conn_match_cb *conn_cb,Curl_cpool_done_match_cb *done_cb,
                     void *userdata)

{
  Curl_share *pCVar1;
  _Bool _Var2;
  Curl_llist *list;
  Curl_llist_node *n;
  connectdata *pcVar3;
  Curl_multi *pCVar4;
  Curl_hash *h;
  
  if (data == (Curl_easy *)0x0) {
LAB_00119a39:
    _Var2 = false;
  }
  else {
    pCVar1 = data->share;
    if ((pCVar1 == (Curl_share *)0x0) || ((pCVar1->specifier & 0x20) == 0)) {
      pCVar4 = data->multi_easy;
      if ((pCVar4 == (Curl_multi *)0x0) && (pCVar4 = data->multi, pCVar4 == (Curl_multi *)0x0))
      goto LAB_00119a39;
      h = &(pCVar4->cpool).dest2bundle;
    }
    else {
      h = &(pCVar1->cpool).dest2bundle;
    }
    if ((h[2].size != 0) && ((*(byte *)(h[2].size + 4) & 0x20) != 0)) {
      Curl_share_lock((Curl_easy *)h[2].dtor,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    *(byte *)&h[3].hash_func = *(byte *)&h[3].hash_func | 1;
    list = (Curl_llist *)Curl_hash_pick(h,destination,dest_len);
    if (list == (Curl_llist *)0x0) {
LAB_00119abb:
      _Var2 = false;
    }
    else {
      n = Curl_llist_head(list);
      do {
        if (n == (Curl_llist_node *)0x0) goto LAB_00119abb;
        pcVar3 = (connectdata *)Curl_node_elem(n);
        n = Curl_node_next(n);
        _Var2 = (*conn_cb)(pcVar3,userdata);
      } while (!_Var2);
      _Var2 = true;
    }
    if (done_cb != (Curl_cpool_done_match_cb *)0x0) {
      _Var2 = (*done_cb)(_Var2,userdata);
    }
    *(byte *)&h[3].hash_func = *(byte *)&h[3].hash_func & 0xfe;
    if ((h[2].size != 0) && ((*(byte *)(h[2].size + 4) & 0x20) != 0)) {
      Curl_share_unlock((Curl_easy *)h[2].dtor,CURL_LOCK_DATA_CONNECT);
    }
  }
  return _Var2;
}

Assistant:

bool Curl_cpool_find(struct Curl_easy *data,
                     const char *destination, size_t dest_len,
                     Curl_cpool_conn_match_cb *conn_cb,
                     Curl_cpool_done_match_cb *done_cb,
                     void *userdata)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_bundle *bundle;
  bool result = FALSE;

  DEBUGASSERT(cpool);
  DEBUGASSERT(conn_cb);
  if(!cpool)
    return FALSE;

  CPOOL_LOCK(cpool);
  bundle = Curl_hash_pick(&cpool->dest2bundle, (void *)destination, dest_len);
  if(bundle) {
    struct Curl_llist_node *curr = Curl_llist_head(&bundle->conns);
    while(curr) {
      struct connectdata *conn = Curl_node_elem(curr);
      /* Get next node now. callback might discard current */
      curr = Curl_node_next(curr);

      if(conn_cb(conn, userdata)) {
        result = TRUE;
        break;
      }
    }
  }

  if(done_cb) {
    result = done_cb(result, userdata);
  }
  CPOOL_UNLOCK(cpool);
  return result;
}